

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

byte * __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::GetRealAddressFromInterior
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *interiorAddress)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  undefined4 *puVar5;
  byte *pbVar6;
  
  pcVar1 = (this->super_HeapBlock).address;
  if (interiorAddress < pcVar1 || pcVar1 + 0x8000 <= interiorAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x308,
                       "(interiorAddress >= this->address && interiorAddress < this->address + AutoSystemInfo::PageSize * this->GetPageCount())"
                       ,
                       "interiorAddress >= this->address && interiorAddress < this->address + AutoSystemInfo::PageSize * this->GetPageCount()"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  uVar4 = GetInteriorAddressIndex(this,interiorAddress);
  pbVar6 = (byte *)0x0;
  if (uVar4 != 0xffff) {
    pbVar6 = (byte *)((this->super_HeapBlock).address + (ulong)this->objectSize * (ulong)uVar4);
  }
  return pbVar6;
}

Assistant:

byte *
SmallHeapBlockT<TBlockAttributes>::GetRealAddressFromInterior(void * interiorAddress)
{
    Assert(interiorAddress >= this->address && interiorAddress < this->address + AutoSystemInfo::PageSize * this->GetPageCount());
    ushort index = GetInteriorAddressIndex(interiorAddress);
    if (index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)
    {
        return (byte *)this->address + index * this->GetObjectSize();
    }
    return nullptr;
}